

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Node<const_void_*,_QCss::StyleSheet>::emplaceValue<QCss::StyleSheet>
          (Node<const_void_*,_QCss::StyleSheet> *this,StyleSheet *args)

{
  StyleSheet *in_RDI;
  long in_FS_OFFSET;
  StyleSheet *this_00;
  StyleSheet local_a8;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &local_a8;
  QCss::StyleSheet::StyleSheet(this_00,in_RDI);
  QCss::StyleSheet::operator=(this_00,in_RDI);
  QCss::StyleSheet::~StyleSheet(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }